

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::delaunizesegments(tetgenmesh *this)

{
  tetrahedron *pppdVar1;
  arraypool *paVar2;
  double *pdVar3;
  interresult iVar4;
  int iVar5;
  point pdVar6;
  ulong uVar7;
  long lVar8;
  arraypool *in_stack_fffffffffffffed8;
  triface searchtet;
  face sseg;
  triface local_f8;
  face local_e8;
  point local_d8;
  point local_d0;
  point local_c8;
  point newpt;
  point refpt;
  face searchsh;
  insertvertexflags local_a0;
  
  local_f8.tet = (tetrahedron *)0x0;
  local_f8.ver = 0;
  searchsh.sh = (shellface *)0x0;
  searchsh.shver = 0;
  local_a0.refinetet.ver = 0;
  local_a0.refinesh.shver = 0;
  local_a0.refinetet.tet = (tetrahedron *)0x0;
  local_a0.refinesh.sh = (shellface *)0x0;
  local_a0.smlen = 0.0;
  local_a0.refineflag = 0;
  local_a0.lawson = 0;
  local_a0.splitbdflag = 0;
  local_a0.validflag = 0;
  local_a0.respectbdflag = 0;
  local_a0.rejflag = 0;
  local_a0.chkencflag = 0;
  local_a0.cdtflag = 0;
  local_a0.bowywat = 1;
  local_a0.sloc = 4;
  local_a0.sbowywat = 1;
  local_a0.assignmeshsize = this->b->metric;
  local_a0.smlenflag = this->useinsertradius;
LAB_0012cf44:
  do {
    while( true ) {
      while( true ) {
        do {
          paVar2 = this->subsegstack;
          if (paVar2->objects < 1) {
            return;
          }
          uVar7 = paVar2->objects - 1;
          paVar2->objects = uVar7;
          lVar8 = (long)paVar2->objectbytes * ((long)paVar2->objectsperblockmark & uVar7);
          sseg.sh = *(shellface **)
                     (paVar2->toparray[uVar7 >> ((byte)paVar2->log2objectsperblock & 0x3f)] + lVar8)
          ;
          sseg.shver = *(int *)(paVar2->toparray
                                [uVar7 >> ((byte)paVar2->log2objectsperblock & 0x3f)] + lVar8 + 8);
          searchtet.ver = (uint)sseg.sh[9] & 0xf;
          searchtet.tet = (tetrahedron *)((ulong)sseg.sh[9] & 0xfffffffffffffff0);
        } while (searchtet.tet != (tetrahedron *)0x0);
        iVar4 = scoutsegment(this,(point)sseg.sh[sorgpivot[sseg.shver]],
                             (point)sseg.sh[sdestpivot[sseg.shver]],&sseg,&searchtet,&refpt,
                             in_stack_fffffffffffffed8);
        if (iVar4 != SHAREEDGE) break;
        sseg.sh[9] = (shellface)((long)searchtet.ver | (ulong)searchtet.tet);
        local_f8.tet = searchtet.tet;
        local_f8.ver = searchtet.ver;
        do {
          tssbond1(this,&local_f8,&sseg);
          pppdVar1 = local_f8.tet + facepivot1[local_f8.ver];
          local_f8.tet = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
          local_f8.ver = facepivot2[local_f8.ver][(uint)*pppdVar1 & 0xf];
        } while (searchtet.tet != local_f8.tet);
      }
      if ((iVar4 & ~INTERSECT) == ACROSSEDGE) break;
LAB_0012d231:
      terminatetetgen(this,2);
    }
    makepoint(this,&newpt,FREESEGVERTEX);
    pdVar6 = newpt;
    getsteinerptonsegment(this,&sseg,refpt,newpt);
    local_a0.iloc = 1;
    iVar5 = insertpoint(this,pdVar6,&searchtet,&searchsh,&sseg,&local_a0);
    if (iVar5 == 0) {
      if (local_a0.iloc == 5) {
        searchtet.ver = eprevtbl[searchtet.ver];
        report_selfint_edge(this,(point)sseg.sh[sorgpivot[sseg.shver]],
                            (point)sseg.sh[sdestpivot[sseg.shver]],&sseg,&searchtet,ACROSSVERT);
      }
      else {
        if ((local_a0.iloc != 9) ||
           ((*(uint *)((long)searchtet.tet[orgpivot[searchtet.ver]] +
                      (long)this->pointmarkindex * 4 + 4) & 0xffffff00) != 0x600))
        goto LAB_0012d231;
        pdVar3 = searchtet.tet[orgpivot[searchtet.ver]][(long)this->point2simindex + 2];
        local_e8.shver = (uint)pdVar3 & 7;
        local_e8.sh = (shellface *)((ulong)pdVar3 & 0xfffffffffffffff8);
        local_d0 = farsorg(this,&sseg);
        local_d8 = farsdest(this,&sseg);
        local_c8 = farsorg(this,&local_e8);
        pdVar6 = farsdest(this,&local_e8);
        puts("Two segments are very close to each other.");
        printf("  Segment 1: [%d, %d] #%d\n",
               (ulong)*(uint *)((long)local_d0 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)local_d8 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)sseg.sh + (long)this->shmarkindex * 4));
        printf("  Segment 2: [%d, %d] #%d\n",
               (ulong)*(uint *)((long)local_c8 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)pdVar6 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)local_e8.sh + (long)this->shmarkindex * 4));
        terminatetetgen(this,4);
      }
      goto LAB_0012cf44;
    }
    this->st_segref_count = this->st_segref_count + 1;
    if (0 < this->steinerleft) {
      this->steinerleft = this->steinerleft + -1;
    }
    if (this->useinsertradius != 0) {
      save_segmentpoint_insradius(this,pdVar6,local_a0.parentpt,local_a0.smlen);
    }
  } while( true );
}

Assistant:

void tetgenmesh::delaunizesegments()
{
  triface searchtet, spintet;
  face searchsh;
  face sseg, *psseg;
  point refpt, newpt;
  enum interresult dir;
  insertvertexflags ivf;
  int t1ver; 


  ivf.bowywat = 1; // Use Bowyer-Watson insertion.
  ivf.sloc = (int) ONEDGE; // on 'sseg'.
  ivf.sbowywat = 1; // Use Bowyer-Watson insertion.
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.

  // Loop until 'subsegstack' is empty.
  while (subsegstack->objects > 0l) {
    // seglist is used as a stack.
    subsegstack->objects--;
    psseg = (face *) fastlookup(subsegstack, subsegstack->objects);
    sseg = *psseg;

    // Check if this segment has been recovered.
    sstpivot1(sseg, searchtet);
    if (searchtet.tet != NULL) {
      continue; // Not a missing segment.
    }

    // Search the segment.
    dir = scoutsegment(sorg(sseg), sdest(sseg), &sseg,&searchtet,&refpt,NULL);

    if (dir == SHAREEDGE) {
      // Found this segment, insert it.
      // Let the segment remember an adjacent tet.
      sstbond1(sseg, searchtet);
      // Bond the segment to all tets containing it.
      spintet = searchtet;
      do {
        tssbond1(spintet, sseg);
        fnextself(spintet);
      } while (spintet.tet != searchtet.tet);
    } else {
      if ((dir == ACROSSFACE) || (dir == ACROSSEDGE)) {
        // The segment is missing. Split it.
        // Create a new point.
        makepoint(&newpt, FREESEGVERTEX);
        //setpointtype(newpt, FREESEGVERTEX);
        getsteinerptonsegment(&sseg, refpt, newpt);

        // Start searching from 'searchtet'.
        ivf.iloc = (int) OUTSIDE;
        // Insert the new point into the tetrahedralization T.
        //   Missing segments and subfaces are queued for recovery.
        //   Note that T is convex (nonconvex = 0).
        if (insertpoint(newpt, &searchtet, &searchsh, &sseg, &ivf)) {
          // The new point has been inserted.
          st_segref_count++;
          if (steinerleft > 0) steinerleft--;
          if (useinsertradius) {
            save_segmentpoint_insradius(newpt, ivf.parentpt, ivf.smlen);
          } 
        } else {
          if (ivf.iloc == (int) NEARVERTEX) {
            // The new point (in the segment) is very close to an existing 
            //   vertex -- a small feature is detected.
            point nearpt = org(searchtet);
            if (pointtype(nearpt) == FREESEGVERTEX) {
              face parentseg;
              sdecode(point2sh(nearpt), parentseg);
              point p1 = farsorg(sseg);
              point p2 = farsdest(sseg);
              point p3 = farsorg(parentseg);
              point p4 = farsdest(parentseg);
              printf("Two segments are very close to each other.\n");
              printf("  Segment 1: [%d, %d] #%d\n", pointmark(p1),
                     pointmark(p2), shellmark(sseg));
              printf("  Segment 2: [%d, %d] #%d\n", pointmark(p3),
                     pointmark(p4), shellmark(parentseg));
              terminatetetgen(this, 4);
            } else {
              terminatetetgen(this, 2);
            }
          } else if (ivf.iloc == (int) ONVERTEX) {
            // The new point (in the segment) is coincident with an existing 
            //   vertex -- a self-intersection is detected.
            eprevself(searchtet);
            report_selfint_edge(sorg(sseg), sdest(sseg), &sseg, &searchtet,
                                ACROSSVERT);
          } else {
            // An unknown case. Report a bug.
            terminatetetgen(this, 2);
          }
        }
      } else {
        // An unknown case. Report a bug.
        terminatetetgen(this, 2);
      }
    }
  } // while
}